

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  __m128i match;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_38;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    bVar7 = false;
  }
  else {
    probe(&local_38,this,hashval);
    auVar8 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar8 = pshuflw(auVar8,auVar8,0);
    while( true ) {
      pcVar1 = this->ctrl_ + local_38.offset_;
      cVar3 = pcVar1[0xf];
      cVar10 = auVar8[0];
      auVar11[0] = -(cVar10 == *pcVar1);
      cVar12 = auVar8[1];
      auVar11[1] = -(cVar12 == pcVar1[1]);
      cVar13 = auVar8[2];
      auVar11[2] = -(cVar13 == pcVar1[2]);
      cVar14 = auVar8[3];
      auVar11[3] = -(cVar14 == pcVar1[3]);
      auVar11[4] = -(cVar10 == pcVar1[4]);
      auVar11[5] = -(cVar12 == pcVar1[5]);
      auVar11[6] = -(cVar13 == pcVar1[6]);
      auVar11[7] = -(cVar14 == pcVar1[7]);
      auVar11[8] = -(cVar10 == pcVar1[8]);
      auVar11[9] = -(cVar12 == pcVar1[9]);
      auVar11[10] = -(cVar13 == pcVar1[10]);
      auVar11[0xb] = -(cVar14 == pcVar1[0xb]);
      auVar11[0xc] = -(cVar10 == pcVar1[0xc]);
      auVar11[0xd] = -(cVar12 == pcVar1[0xd]);
      auVar11[0xe] = -(cVar13 == pcVar1[0xe]);
      auVar11[0xf] = -(cVar14 == cVar3);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar11[0xf] >> 7) << 0xf); bVar7 = uVar4 != 0, bVar7;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar6 = uVar2 + local_38.offset_ & local_38.mask_;
        if ((this->slots_[uVar6].value.first == elem->first) &&
           (*(int *)((long)this->slots_ + uVar6 * 0x10 + 8) == elem->second)) {
          return bVar7;
        }
      }
      auVar9[0] = -(*pcVar1 == -0x80);
      auVar9[1] = -(pcVar1[1] == -0x80);
      auVar9[2] = -(pcVar1[2] == -0x80);
      auVar9[3] = -(pcVar1[3] == -0x80);
      auVar9[4] = -(pcVar1[4] == -0x80);
      auVar9[5] = -(pcVar1[5] == -0x80);
      auVar9[6] = -(pcVar1[6] == -0x80);
      auVar9[7] = -(pcVar1[7] == -0x80);
      auVar9[8] = -(pcVar1[8] == -0x80);
      auVar9[9] = -(pcVar1[9] == -0x80);
      auVar9[10] = -(pcVar1[10] == -0x80);
      auVar9[0xb] = -(pcVar1[0xb] == -0x80);
      auVar9[0xc] = -(pcVar1[0xc] == -0x80);
      auVar9[0xd] = -(pcVar1[0xd] == -0x80);
      auVar9[0xe] = -(pcVar1[0xe] == -0x80);
      auVar9[0xf] = -(cVar3 == -0x80);
      if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar9 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar9 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar9 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar9 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar9 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar9 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar9 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar9 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar9 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar9 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar9 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80)
      break;
      lVar5 = local_38.offset_ + local_38.index_;
      local_38.index_ = local_38.index_ + 0x10;
      local_38.offset_ = lVar5 + 0x10U & local_38.mask_;
      if (this->capacity_ <= local_38.index_) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::EnumClass, int>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::EnumClass, int>>]"
                     );
      }
    }
  }
  return bVar7;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }